

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_rounded_box.cxx
# Opt level: O2

void rbox(int fill,int x,int y,int w,int h)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  iVar3 = (w * 2) / 5;
  iVar1 = (h * 2) / 5;
  if (iVar3 < iVar1) {
    iVar1 = iVar3;
  }
  iVar3 = 0xf;
  if (iVar1 < 0xf) {
    iVar3 = iVar1;
  }
  iVar2 = 4;
  if (iVar1 != 5) {
    iVar2 = iVar3;
  }
  iVar1 = 8;
  if (iVar2 != 7) {
    iVar1 = iVar2;
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[(ulong)(fill != 0) + 0x1a])
            (fl_graphics_driver,5,(long)(h * 2) % 5 & 0xffffffff);
  dVar6 = (double)iVar1;
  pdVar4 = offset + 4;
  for (lVar5 = 0; lVar5 != 0x28; lVar5 = lVar5 + 8) {
    fl_vertex_r(*pdVar4 * dVar6 + (double)x,*(double *)((long)offset + lVar5) * dVar6 + (double)y);
    pdVar4 = pdVar4 + -1;
  }
  dVar7 = (double)(h + y + -1);
  pdVar4 = offset + 4;
  for (lVar5 = 0; lVar5 != 0x28; lVar5 = lVar5 + 8) {
    fl_vertex_r(*(double *)((long)offset + lVar5) * dVar6 + (double)x,dVar7 - *pdVar4 * dVar6);
    pdVar4 = pdVar4 + -1;
  }
  dVar8 = (double)(w + x + -1);
  pdVar4 = offset + 4;
  for (lVar5 = 0; lVar5 != 0x28; lVar5 = lVar5 + 8) {
    fl_vertex_r(dVar8 - *pdVar4 * dVar6,dVar7 - *(double *)((long)offset + lVar5) * dVar6);
    pdVar4 = pdVar4 + -1;
  }
  pdVar4 = offset + 4;
  for (lVar5 = 0; lVar5 != 0x28; lVar5 = lVar5 + 8) {
    fl_vertex_r(dVar8 - *(double *)((long)offset + lVar5) * dVar6,*pdVar4 * dVar6 + (double)y);
    pdVar4 = pdVar4 + -1;
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[(ulong)(fill != 0) + 0x24])();
  return;
}

Assistant:

static void rbox(int fill, int x, int y, int w, int h) {
  int i;
  int rs, rsy;
  rs = w*2/5; rsy = h*2/5;
  if (rs > rsy) rs = rsy; // use smaller radius
  if (rs > RS) rs = RS;
  if (rs == 5) rs = 4;	// use only even sizes for small corners (STR #2943)
  if (rs == 7) rs = 8;	// note: 8 is better than 6 (really)

  if (fill) fl_begin_polygon(); else fl_begin_loop();
  for (i=0; i<RN; i++)
    fl_vertex_r(x + offset[RN-i-1]*rs, y + offset[i] * rs);
  for (i=0; i<RN; i++)
    fl_vertex_r(x + offset[i]*rs, y + h-1 - offset[RN-i-1] * rs);
  for (i=0; i<RN; i++)
    fl_vertex_r(x + w-1 - offset[RN-i-1]*rs, y + h-1 - offset[i] * rs);
  for (i=0; i<RN; i++)
    fl_vertex_r(x + w-1 - offset[i]*rs, y + offset[RN-i-1] * rs);
  if (fill) fl_end_polygon(); else fl_end_loop();
}